

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Expression * __thiscall
wasm::TranslateToFuzzReader::makeThrow(TranslateToFuzzReader *this,Type type)

{
  char *pcVar1;
  Tag *pTVar2;
  value_type *pvVar3;
  Type *pTVar4;
  uintptr_t *puVar5;
  Throw *pTVar6;
  Module *pMVar7;
  Name NVar8;
  IString IVar9;
  HeapType local_78;
  Type local_70;
  Type tagType;
  undefined1 local_58 [8];
  Iterator __begin1;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> operands;
  
  if (type.id != 1) {
    __assert_fail("type == Type::unreachable",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x1438,"Expression *wasm::TranslateToFuzzReader::makeThrow(Type)");
  }
  if (this->trivialNesting == 0) {
    pMVar7 = this->wasm;
    if ((pMVar7->tags).
        super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pMVar7->tags).
        super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      addTag(this);
      pMVar7 = this->wasm;
    }
    pvVar3 = Random::
             pick<std::vector<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>,std::allocator<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>>>>
                       (&this->random,&pMVar7->tags);
    pTVar2 = (pvVar3->_M_t).super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
             super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
  }
  else if ((this->trivialTag).super_IString.str._M_str == (char *)0x0) {
    pMVar7 = this->wasm;
    NVar8.super_IString.str = (IString)wasm::IString::interned(4,"tag$",0);
    IVar9.str = (string_view)Names::getValidTagName(pMVar7,NVar8);
    wasm::HeapType::HeapType(&local_78,(Signature)ZEXT816(0));
    __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
         (size_t)operator_new(0x40);
    (((IString *)
     (__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index + 0x10))->
    str)._M_len = 0;
    *(char **)(__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index +
               0x10 + 8) = (char *)0x0;
    (((IString *)
     (__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index + 0x20))->
    str)._M_len = 0;
    *(char **)(__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index +
               0x20 + 8) = (char *)0x0;
    (((IString *)
     (__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index + 0x30))->
    str)._M_len = 0;
    ((IString *)__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index)
    ->str = IVar9.str;
    *(uintptr_t *)
     (__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index + 0x30 + 8)
         = local_78.id;
    pTVar2 = (Tag *)wasm::Module::addTag((unique_ptr *)this->wasm);
    pcVar1 = *(char **)((long)&(pTVar2->super_Importable).super_Named.name.super_IString.str + 8);
    (this->trivialTag).super_IString.str._M_len =
         (pTVar2->super_Importable).super_Named.name.super_IString.str._M_len;
    (this->trivialTag).super_IString.str._M_str = pcVar1;
    if (__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index != 0) {
      operator_delete((void *)__begin1.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index,0x40);
    }
  }
  else {
    NVar8.super_IString.str._M_str = (char *)(this->trivialTag).super_IString.str._M_len;
    NVar8.super_IString.str._M_len = (size_t)this->wasm;
    pTVar2 = (Tag *)wasm::Module::getTag(NVar8);
  }
  local_70.id = wasm::HeapType::getSignature();
  local_58 = (undefined1  [8])&local_70;
  __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
  __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  pTVar4 = (Type *)Type::size((Type *)local_58);
  if (pTVar4 != (Type *)0x0) {
    do {
      do {
        puVar5 = (uintptr_t *)wasm::Type::Iterator::operator*((Iterator *)local_58);
        tagType.id = (uintptr_t)make(this,*puVar5);
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                   &__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                    index,(Expression **)&tagType);
        __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
             (Type *)((long)&(__begin1.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             parent)->id + 1);
      } while (__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
               != pTVar4);
    } while (local_58 != (undefined1  [8])&local_70);
  }
  pTVar6 = Builder::makeThrow<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                     (&this->builder,
                      (IString)(pTVar2->super_Importable).super_Named.name.super_IString,
                      (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                      &__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                       index);
  if (__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index != 0) {
    operator_delete((void *)__begin1.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            index,
                    -__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     index);
  }
  return (Expression *)pTVar6;
}

Assistant:

Expression* TranslateToFuzzReader::makeThrow(Type type) {
  assert(type == Type::unreachable);
  Tag* tag;
  if (trivialNesting) {
    // We are nested under a makeTrivial call, so only emit something trivial.
    // Get (or create) a trivial tag, so we have no operands (and will not call
    // make(), below). Otherwise, we might recurse very deeply if we threw a
    // tag that contains an exnref (for which we may end up creating yet another
    // throw in a try).
    if (!trivialTag) {
      auto newTag = builder.makeTag(Names::getValidTagName(wasm, "tag$"),
                                    Signature(Type::none, Type::none));
      tag = wasm.addTag(std::move(newTag));
      trivialTag = tag->name;
    } else {
      tag = wasm.getTag(trivialTag);
    }
  } else {
    // Get a random tag, adding a random one if necessary.
    if (wasm.tags.empty()) {
      addTag();
    }
    tag = pick(wasm.tags).get();
  }
  auto tagType = tag->params();
  std::vector<Expression*> operands;
  for (auto t : tagType) {
    operands.push_back(make(t));
  }
  return builder.makeThrow(tag, operands);
}